

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

char * qpdf_oh_unparse_resolved(qpdf_data qpdf,qpdf_oh oh)

{
  char *pcVar1;
  anon_class_8_1_8990bbdf local_68;
  function<const_char_*(QPDFObjectHandle_&)> local_60;
  char *local_40;
  function<const_char_*()> local_38;
  qpdf_oh local_14;
  qpdf_data p_Stack_10;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_40 = "";
  local_14 = oh;
  p_Stack_10 = qpdf;
  return_T<char_const*>(&local_38,&local_40);
  local_68.qpdf = p_Stack_10;
  std::function<char_const*(QPDFObjectHandle&)>::function<qpdf_oh_unparse_resolved::__0,void>
            ((function<char_const*(QPDFObjectHandle&)> *)&local_60,&local_68);
  pcVar1 = do_with_oh<char_const*>(qpdf,oh,&local_38,&local_60);
  std::function<const_char_*(QPDFObjectHandle_&)>::~function(&local_60);
  std::function<const_char_*()>::~function(&local_38);
  return pcVar1;
}

Assistant:

char const*
qpdf_oh_unparse_resolved(qpdf_data qpdf, qpdf_oh oh)
{
    return do_with_oh<char const*>(
        qpdf, oh, return_T<char const*>(""), [qpdf](QPDFObjectHandle& o) {
            QTC::TC("qpdf", "qpdf-c called qpdf_oh_unparse_resolved");
            qpdf->tmp_string = o.unparseResolved();
            return qpdf->tmp_string.c_str();
        });
}